

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

matrix __thiscall sptk::swipe::im2m(swipe *this,intmatrix yr_matrix)

{
  long lVar1;
  double *pdVar2;
  ulong uVar3;
  uint xSz;
  ulong uVar4;
  int ySz;
  matrix mVar5;
  
  ySz = (int)((ulong)this >> 0x20);
  xSz = (uint)this;
  mVar5 = makem(xSz,ySz);
  if (0 < (int)xSz) {
    uVar3 = 0;
    do {
      if (ySz != 0 && -1 < (long)this) {
        lVar1 = *(long *)(yr_matrix._0_8_ + uVar3 * 8);
        pdVar2 = mVar5.m[uVar3];
        uVar4 = 0;
        do {
          pdVar2[uVar4] = (double)*(int *)(lVar1 + uVar4 * 4);
          uVar4 = uVar4 + 1;
        } while ((ulong)this >> 0x20 != uVar4);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (xSz & 0x7fffffff));
  }
  return mVar5;
}

Assistant:

matrix im2m(intmatrix yr_matrix) {
    matrix nw_matrix = makem(yr_matrix.x, yr_matrix.y);
    int i, j;
    for (i = 0; i < yr_matrix.x; i++)
        for (j = 0; j < yr_matrix.y; j++)
            nw_matrix.m[i][j] = yr_matrix.m[i][j];
    return(nw_matrix);
}